

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int getfield(lua_State *L,char *key,int d)

{
  int iVar1;
  lua_Integer lVar2;
  int in_EDX;
  lua_State *in_RSI;
  lua_State *in_RDI;
  int res;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  undefined4 local_18;
  int iVar3;
  
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  local_18 = in_EDX;
  iVar1 = lua_isnumber((lua_State *)CONCAT44(d,res),(int)((ulong)in_RDI >> 0x20));
  iVar3 = local_18;
  if (iVar1 == 0) {
    if (local_18 < 0) {
      lj_err_callerv(in_RDI,LJ_ERR_OSDATEF,in_RSI);
    }
  }
  else {
    lVar2 = lua_tointeger((lua_State *)key,d);
    local_18 = (int)lVar2;
  }
  lua_settop(in_RSI,iVar3);
  return local_18;
}

Assistant:

static int getfield(lua_State *L, const char *key, int d)
{
  int res;
  lua_getfield(L, -1, key);
  if (lua_isnumber(L, -1)) {
    res = (int)lua_tointeger(L, -1);
  } else {
    if (d < 0)
      lj_err_callerv(L, LJ_ERR_OSDATEF, key);
    res = d;
  }
  lua_pop(L, 1);
  return res;
}